

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc.cpp
# Opt level: O0

void * parse_FACT(SymbolContext<char> *ctx)

{
  char *pcVar1;
  SymbolContext<char> *this;
  size_t in_RCX;
  void *__buf;
  SymbolContext<char> local_38;
  SymbolContext<char> *local_18;
  SymbolContext<char> *ctx_local;
  
  local_18 = ctx;
  pcVar1 = Centaurus::SymbolContext<char>::start(ctx);
  if (*pcVar1 == '(') {
    ctx_local = (SymbolContext<char> *)Centaurus::SymbolContext<char>::value<Number>(local_18,1);
  }
  else {
    this = (SymbolContext<char> *)operator_new(4);
    Centaurus::SymbolContext<char>::read_abi_cxx11_(&local_38,(int)local_18,__buf,in_RCX);
    Number::Number((Number *)this,(string *)&local_38);
    ctx_local = this;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return ctx_local;
}

Assistant:

void *parse_FACT(const SymbolContext<char>& ctx)
{
    if (ctx.start()[0] == '(')
        return ctx.value<Number>(1);
    else
        return new Number(ctx.read());
}